

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.c
# Opt level: O2

int al_ustr_find_set(ALLEGRO_USTR *us,int start_pos,ALLEGRO_USTR *accept)

{
  _Bool _Var1;
  int iVar2;
  int32_t c;
  int iVar3;
  int32_t iVar4;
  ulong in_RAX;
  size_t sVar5;
  ulong uStack_38;
  int set_pos;
  
  uStack_38 = in_RAX;
  _Var1 = all_ascii(accept);
  if (_Var1) {
    iVar2 = _al_binchr(us,start_pos,accept);
    return iVar2;
  }
  iVar2 = 0;
  do {
    c = al_ustr_get(us,iVar2);
    iVar3 = 1;
    if (c != -2) {
      if (c == -1) {
        return -1;
      }
      uStack_38 = uStack_38 & 0xffffffff;
      while (iVar4 = al_ustr_get_next(accept,&set_pos), iVar4 != -1) {
        if (c == iVar4) {
          return iVar2;
        }
      }
      sVar5 = al_utf8_width(c);
      iVar3 = (int)sVar5;
    }
    iVar2 = iVar2 + iVar3;
  } while( true );
}

Assistant:

int al_ustr_find_set(const ALLEGRO_USTR *us, int start_pos,
   const ALLEGRO_USTR *accept)
{
   int rc;
   int32_t c, d;
   int pos;
   int set_pos;

   /* Fast path for ASCII characters. */
   if (all_ascii(accept)) {
      rc = _al_binchr(us, start_pos, accept);
      return (rc == _AL_BSTR_ERR) ? -1 : rc;
   }

   /* Non-ASCII. */
   pos = 0;
   while ((c = al_ustr_get(us, pos)) != -1) {
      if (c == -2) {
         /* Invalid byte sequence. */
         pos++;
         continue;
      }

      set_pos = 0;
      while ((d = al_ustr_get_next(accept, &set_pos)) != -1) {
         if (c == d)
            return pos;
      }

      pos += al_utf8_width(c);
   }

   return -1;
}